

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::TcParser::DestroyMapNode
               (NodeBase *node,MapAuxInfo map_info,UntypedMapBase *map)

{
  CppType CVar1;
  string *psVar2;
  MessageLite *this;
  UntypedMapBase *map_local;
  NodeBase *node_local;
  MapAuxInfo map_info_local;
  
  node_local = (NodeBase *)map_info;
  CVar1 = MapTypeCard::cpp_type((MapTypeCard *)&node_local);
  if (CVar1 == kString) {
    psVar2 = (string *)NodeBase::GetVoidKey(node);
    std::__cxx11::string::~string(psVar2);
  }
  CVar1 = MapTypeCard::cpp_type((MapTypeCard *)((long)&node_local + 1));
  if (CVar1 == kString) {
    psVar2 = (string *)NodeBase::GetVoidValue(node,node_local._4_4_);
    std::__cxx11::string::~string(psVar2);
  }
  else {
    CVar1 = MapTypeCard::cpp_type((MapTypeCard *)((long)&node_local + 1));
    if (CVar1 == kMessage) {
      this = (MessageLite *)NodeBase::GetVoidValue(node,node_local._4_4_);
      MessageLite::DestroyInstance(this);
    }
  }
  UntypedMapBase::DeallocNode(map,node,node_local._4_4_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TcParser::DestroyMapNode(NodeBase* node,
                                                MapAuxInfo map_info,
                                                UntypedMapBase& map) {
  if (map_info.key_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidKey())->~basic_string();
  }
  if (map_info.value_type_card.cpp_type() == MapTypeCard::kString) {
    static_cast<std::string*>(node->GetVoidValue(map_info.node_size_info))
        ->~basic_string();
  } else if (map_info.value_type_card.cpp_type() == MapTypeCard::kMessage) {
    static_cast<MessageLite*>(node->GetVoidValue(map_info.node_size_info))
        ->DestroyInstance();
  }
  map.DeallocNode(node, map_info.node_size_info);
}